

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::copyAttGroupAttributes
          (TraverseSchema *this,DOMElement *elem,XercesAttGroupInfo *fromAttGroup,
          XercesAttGroupInfo *toAttGroup,ComplexTypeInfo *typeInfo)

{
  uint uri;
  DatatypeValidator *pDVar1;
  XMLCh *name;
  bool bVar2;
  SchemaAttDef *pSVar3;
  SchemaAttDef *pSVar4;
  int errorCode;
  XMLSize_t XVar5;
  XMLSize_t j;
  XMLSize_t index;
  XMLSize_t local_38;
  
  if (fromAttGroup->fAttributes == (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = (fromAttGroup->fAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).
               fCurCount;
  }
  XVar5 = 0;
  do {
    if (local_38 == XVar5) {
      if (toAttGroup != (XercesAttGroupInfo *)0x0) {
        if (fromAttGroup->fAnyAttributes == (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
          XVar5 = 0;
        }
        else {
          XVar5 = (fromAttGroup->fAnyAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).
                  fCurCount;
        }
        for (index = 0; XVar5 != index; index = index + 1) {
          pSVar3 = XercesAttGroupInfo::anyAttributeAt(fromAttGroup,index);
          XercesAttGroupInfo::addAnyAttDef(toAttGroup,pSVar3,true);
        }
      }
      return;
    }
    pSVar3 = XercesAttGroupInfo::attributeAt(fromAttGroup,XVar5);
    pDVar1 = pSVar3->fDatatypeValidator;
    name = pSVar3->fAttName->fLocalPart;
    uri = pSVar3->fAttName->fURIId;
    if (typeInfo == (ComplexTypeInfo *)0x0) {
      bVar2 = XercesAttGroupInfo::containsAttribute(toAttGroup,name,uri);
      if (bVar2) goto LAB_0031efc0;
      if ((pDVar1 != (DatatypeValidator *)0x0) && (pDVar1->fType == ID)) {
        if (toAttGroup->fTypeWithId == true) {
          reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x8a,name,(XMLCh *)0x0,
                            (XMLCh *)0x0,(XMLCh *)0x0);
          goto LAB_0031f08c;
        }
        toAttGroup->fTypeWithId = true;
      }
LAB_0031f07e:
      XercesAttGroupInfo::addAttDef(toAttGroup,pSVar3,true);
    }
    else {
      pSVar4 = ComplexTypeInfo::getAttDef(typeInfo,name,uri);
      if (pSVar4 == (SchemaAttDef *)0x0) {
        if ((pDVar1 != (DatatypeValidator *)0x0) && (pDVar1->fType == ID)) {
          if (typeInfo->fAttWithTypeId == true) {
            errorCode = 0x89;
            goto LAB_0031efdb;
          }
          typeInfo->fAttWithTypeId = true;
        }
        pSVar4 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
        SchemaAttDef::SchemaAttDef(pSVar4,pSVar3);
        ComplexTypeInfo::addAttDef(typeInfo,pSVar4);
        if (pSVar4->fBaseAttDecl == (SchemaAttDef *)0x0) {
          pSVar4->fBaseAttDecl = pSVar3;
        }
        if (toAttGroup != (XercesAttGroupInfo *)0x0) goto LAB_0031f07e;
      }
      else {
LAB_0031efc0:
        errorCode = 0x31;
LAB_0031efdb:
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,errorCode,name,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
LAB_0031f08c:
    XVar5 = XVar5 + 1;
  } while( true );
}

Assistant:

void TraverseSchema::copyAttGroupAttributes(const DOMElement* const elem,
                                            XercesAttGroupInfo* const fromAttGroup,
                                            XercesAttGroupInfo* const toAttGroup,
                                            ComplexTypeInfo* const typeInfo) {

    XMLSize_t attCount = fromAttGroup->attributeCount();

    for (XMLSize_t i=0; i < attCount; i++) {

        SchemaAttDef* attDef = fromAttGroup->attributeAt(i);
        QName* attName = attDef->getAttName();
        const XMLCh* localPart = attName->getLocalPart();
        DatatypeValidator* attDV = attDef->getDatatypeValidator();

        if (typeInfo) {

            if (typeInfo->getAttDef(localPart, attName->getURI())) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateAttribute, localPart);
                continue;
            }

            if (attDV && attDV->getType() == DatatypeValidator::ID) {

                if (typeInfo->containsAttWithTypeId()) {

                    reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttDeclPropCorrect5, localPart);
                    continue;
                }

                typeInfo->setAttWithTypeId(true);
            }

            SchemaAttDef* clonedAttDef = new (fGrammarPoolMemoryManager) SchemaAttDef(attDef);
            typeInfo->addAttDef(clonedAttDef);

            if (!clonedAttDef->getBaseAttDecl())
                clonedAttDef->setBaseAttDecl(attDef);

            if (toAttGroup) {
                toAttGroup->addAttDef(attDef, true);
            }
        }
        else {

            if (toAttGroup->containsAttribute(localPart, attName->getURI())) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateAttribute, localPart);
                continue;
            }

            if (attDV && attDV->getType() == DatatypeValidator::ID) {

                if (toAttGroup->containsTypeWithId()) {

                    reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttGrpPropCorrect3, localPart);
                    continue;
                }

                toAttGroup->setTypeWithId(true);
            }

            toAttGroup->addAttDef(attDef, true);
        }
    }

    if (toAttGroup) {
        XMLSize_t anyAttCount = fromAttGroup->anyAttributeCount();

        for (XMLSize_t j=0; j < anyAttCount; j++) {
            toAttGroup->addAnyAttDef(fromAttGroup->anyAttributeAt(j), true);
        }
    }
}